

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int ws_listener_get_send_text(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  iVar1 = nni_copyout_bool(*(_Bool *)((long)arg + 0x113),buf,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return iVar1;
}

Assistant:

static int
ws_listener_get_send_text(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;
	nni_mtx_lock(&l->mtx);
	rv = nni_copyout_bool(l->send_text, buf, szp, t);
	nni_mtx_unlock(&l->mtx);
	return (rv);
}